

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O0

bool __thiscall cppnet::Bitmap::Insert(Bitmap *this,uint32_t index)

{
  bool bVar1;
  size_type sVar2;
  ulong *puVar3;
  uint32_t bit_index;
  uint32_t bitmap_index;
  uint32_t index_local;
  Bitmap *this_local;
  
  sVar2 = std::vector<long,_std::allocator<long>_>::size(&this->_bitmap);
  bVar1 = (ulong)index <= sVar2 << 6;
  if (bVar1) {
    puVar3 = (ulong *)std::vector<long,_std::allocator<long>_>::operator[]
                                (&this->_bitmap,(ulong)(index >> 6));
    *puVar3 = 1L << ((byte)index & 0x3f) | *puVar3;
    this->_vec_bitmap = this->_vec_bitmap | (uint)(1L << ((byte)(index >> 6) & 0x3f));
  }
  return bVar1;
}

Assistant:

bool Bitmap::Insert(uint32_t index) {
    if (index > _bitmap.size() * __step_size) {
        return false;
    }

    // get index in vector
    uint32_t bitmap_index = index / __step_size;
    // get index in uint64_t
    uint32_t bit_index = index % __step_size;

    _bitmap[bitmap_index] |= __setp_base << bit_index;
    _vec_bitmap |= __setp_base << bitmap_index;

    return true;
}